

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

result_type __thiscall
math::wide_integer::uniform_int_distribution<2048u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<2048u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  bool bVar1;
  uint uVar2;
  void *in_RCX;
  long lVar3;
  sbyte sVar4;
  byte bVar5;
  result_type range;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_430;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_330;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_230;
  uintwide_t<24U,_unsigned_char,_void,_false> local_130 [85];
  
  bVar5 = 0;
  uintwide_t<2048u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
            (this,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  uVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + (ulong)((bVar5 & 3) == 0) * 4) {
    if ((bVar5 & 3) == 0) {
      uVar2 = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                        ((linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
                         input_params);
    }
    sVar4 = (bVar5 & 3) << 3;
    *(uint *)(this + lVar3) = *(uint *)(this + lVar3) | (uVar2 >> sVar4 & 0xff) << sVar4;
    bVar5 = bVar5 + 1;
  }
  memcpy(&local_230,in_RCX,0x100);
  uintwide_t<2048U,_unsigned_int,_void,_false>::limits_helper_min<false>();
  bVar1 = uintwide_t<2048U,_unsigned_int,_void,_false>::operator!=
                    (&local_230,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_430);
  if (!bVar1) {
    memcpy(&local_330,(void *)((long)in_RCX + 0x100),0x100);
    uintwide_t<2048U,_unsigned_int,_void,_false>::limits_helper_max<false>();
    bVar1 = uintwide_t<2048U,_unsigned_int,_void,_false>::operator!=(&local_330,local_130);
    if (!bVar1) goto LAB_0014d7f7;
  }
  memcpy(&local_430,(void *)((long)in_RCX + 0x100),0x100);
  memcpy(&local_330,in_RCX,0x100);
  wide_integer::operator-
            ((wide_integer *)&local_230,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_430,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_330);
  uintwide_t<2048U,_unsigned_int,_void,_false>::preincrement(&local_230);
  uintwide_t<2048U,_unsigned_int,_void,_false>::operator%=
            ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,&local_230);
  memcpy(&local_430,in_RCX,0x100);
  uintwide_t<2048U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,&local_430);
LAB_0014d7f7:
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }